

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseData.cpp
# Opt level: O3

bool __thiscall
SGParser::Generator::StdGrammarParseData::CreateSymbolMap
          (StdGrammarParseData *this,StdGrammarParseHandler *data,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          *symbols,vector<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
                   *productions,vector<unsigned_int,_std::allocator<unsigned_int>_> *startSymbols)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *this_01;
  _Rb_tree_header *p_Var2;
  _Rb_tree_header *p_Var3;
  char cVar4;
  float fVar5;
  pointer pPVar6;
  size_t line;
  key_type *pkVar7;
  iterator __position;
  uint uVar8;
  int iVar9;
  uint uVar10;
  mapped_type_conflict1 *pmVar11;
  iterator iVar12;
  uint *puVar13;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar14;
  mapped_type *this_02;
  mapped_type *pmVar15;
  pointer pbVar16;
  mapped_type *pmVar17;
  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
  *p_Var18;
  pointer pbVar19;
  float *pfVar20;
  mapped_type *pmVar21;
  undefined1 auVar22 [8];
  uint prec;
  uint uVar23;
  ulong uVar24;
  _Base_ptr p_Var25;
  uint *pright;
  pointer puVar26;
  char *pcVar27;
  _Base_ptr p_Var28;
  char cVar29;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *symbol;
  long lVar30;
  key_type *pkVar31;
  ulong uVar32;
  _Rb_tree_header *p_Var33;
  pointer pvVar34;
  ulong uVar35;
  pointer __k;
  pointer __k_00;
  bool bVar36;
  bool bVar37;
  undefined1 local_2a0 [8];
  Production p;
  map<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
  reduceData;
  size_t errorCount;
  undefined1 local_160 [8];
  anon_class_16_2_e3ac8062 checkForErrorAndReport;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  nonTerminals;
  uint *puStack_118;
  vector<unsigned_int,_std::allocator<unsigned_int>_> rhs;
  key_type local_c4;
  key_type *pkStack_c0;
  uint nonterm;
  pointer local_b8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vStack_b0;
  ulong local_98;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *local_90;
  undefined1 auStack_88 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> leftSymbolErrorTerminal;
  undefined1 auStack_68 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> leftSymbolId;
  float local_38;
  float local_34 [2];
  uint symbolId;
  
  checkForErrorAndReport.this =
       (StdGrammarParseData *)&reduceData._M_t._M_impl.super__Rb_tree_header._M_node_count;
  reduceData._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  nonTerminals._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&nonTerminals;
  nonTerminals._M_t._M_impl._0_4_ = 0;
  nonTerminals._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  nonTerminals._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  nonTerminals._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  __k = (data->Productions).
        super__Vector_base<SGParser::Generator::StdGrammarParseHandler::ProductionData,_std::allocator<SGParser::Generator::StdGrammarParseHandler::ProductionData>_>
        ._M_impl.super__Vector_impl_data._M_start;
  pPVar6 = (data->Productions).
           super__Vector_base<SGParser::Generator::StdGrammarParseHandler::ProductionData,_std::allocator<SGParser::Generator::StdGrammarParseHandler::ProductionData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_160 = (undefined1  [8])this;
  nonTerminals._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       nonTerminals._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_90 = &symbols->_M_t;
  if (__k != pPVar6) {
    uVar8 = (int)((ulong)((long)(this->UserLex).TokenLexemes.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->UserLex).TokenLexemes.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 2) + 2;
    nonTerminals._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)&(symbols->_M_t)._M_impl.super__Rb_tree_header;
    this_00 = &(this->UserLex).LexemeAliasToToken;
    p_Var1 = &(this->UserLex).LexemeAliasToToken._M_t._M_impl.super__Rb_tree_header;
    this_01 = &(this->UserLex).LexemeNameToToken;
    p_Var2 = &(this->UserLex).LexemeNameToToken._M_t._M_impl.super__Rb_tree_header;
    p_Var3 = &(this->UserLex).Precedence._M_t._M_impl.super__Rb_tree_header;
    local_38 = 0.0;
    do {
      local_2a0 = (undefined1  [8])&p.Name._M_string_length;
      p.Name._M_dataplus._M_p = (pointer)0x0;
      p.Name._M_string_length._0_1_ = 0;
      p.Line._4_4_ = 0;
      p.ReduceOverrides._M_t._M_impl._0_4_ = 0;
      p.ReduceOverrides._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      p.ReduceOverrides._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      p.Line._0_1_ = 0;
      p.Left = 0;
      p.Length = 0;
      p.pRight = (uint *)0x0;
      p.Name.field_2._8_8_ = 0;
      p.Id = 0;
      p.Precedence = 0;
      p.ReduceOverrides._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)&p.ReduceOverrides;
      p.ConflictActions._M_t._M_impl._0_4_ = 0;
      p.ConflictActions._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      p.ConflictActions._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      p.LeftChain.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      p.LeftChain.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      p.ReduceOverrides._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      p.ReduceOverrides._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      p.ConflictActions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)&p.ConflictActions;
      p.ConflictActions._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      rhs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      puStack_118 = (uint *)0x0;
      rhs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      reduceData._M_t._M_impl._0_4_ = 0;
      reduceData._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      reduceData._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      reduceData._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&reduceData;
      reduceData._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      p.ReduceOverrides._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           p.ReduceOverrides._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p.ConflictActions._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           p.ConflictActions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      reduceData._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           reduceData._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                ::operator[](&data->ProductionLines,&__k->Name);
      pbVar19 = (__k->Right).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar16 = (__k->Right).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar16 == pbVar19) {
        prec = 0;
LAB_00130de1:
        bVar37 = false;
      }
      else {
        line = *pmVar11;
        pcVar27 = (pbVar19->_M_dataplus)._M_p;
        cVar29 = *pcVar27;
        if (cVar29 == '*') {
          prec = 0;
          local_98 = 0;
        }
        else {
          local_98 = 0;
          prec = 0;
          __k_00 = pbVar19;
          do {
            if (cVar29 == '$') {
              std::__cxx11::string::substr((ulong)auStack_68,(ulong)__k_00);
              std::__cxx11::string::operator=((string *)__k_00,(string *)auStack_68);
              if (auStack_68 !=
                  (undefined1  [8])
                  &leftSymbolId.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish) {
                operator_delete((void *)auStack_68,
                                (long)leftSymbolId.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_finish + 1);
              }
              pcVar27 = (__k_00->_M_dataplus)._M_p;
            }
            local_34[0] = -NAN;
            if (*pcVar27 == '%') {
              if (pcVar27[6] != '(') goto LAB_00130ef8;
              iVar12 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                       ::find(local_90,__k_00);
              if (iVar12._M_node !=
                  (_Base_ptr)nonTerminals._M_t._M_impl.super__Rb_tree_header._M_node_count) {
                pfVar20 = (float *)std::
                                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                                 *)local_90,__k_00);
                goto LAB_00130f23;
              }
              local_34[0] = (float)(uVar8 | 0x40000000);
              uVar8 = uVar8 + 1;
            }
            else {
              if (*pcVar27 == '\'') {
                std::__cxx11::string::substr((ulong)auStack_68,(ulong)__k_00);
                std::__cxx11::string::operator=((string *)__k_00,(string *)auStack_68);
                if (auStack_68 !=
                    (undefined1  [8])
                    &leftSymbolId.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish) {
                  operator_delete((void *)auStack_68,
                                  (long)leftSymbolId.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_finish + 1);
                }
                iVar12 = std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         ::find(&this_00->_M_t,__k_00);
                if ((_Rb_tree_header *)iVar12._M_node == p_Var1) {
                  CreateSymbolMap::anon_class_16_2_e3ac8062::operator()
                            ((anon_class_16_2_e3ac8062 *)local_160,line,
                             "Undefined alias referenced - \'%s\'",(__k_00->_M_dataplus)._M_p);
                  goto LAB_00130f28;
                }
                pfVar20 = (float *)std::
                                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                   ::operator[](this_00,__k_00);
              }
              else {
LAB_00130ef8:
                iVar12 = std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         ::find(&this_01->_M_t,__k_00);
                if ((_Rb_tree_header *)iVar12._M_node == p_Var2) {
                  iVar9 = std::__cxx11::string::compare((char *)__k_00);
                  if (iVar9 == 0) {
                    local_34[0] = 0.0;
                  }
                  else {
                    iVar9 = std::__cxx11::string::compare((char *)__k_00);
                    if (iVar9 == 0) {
                      local_34[0] = 1.0842022e-19;
                    }
                  }
                  goto LAB_00130f28;
                }
                pfVar20 = (float *)std::
                                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                   ::operator[](this_01,__k_00);
              }
LAB_00130f23:
              local_34[0] = *pfVar20;
            }
LAB_00130f28:
            pbVar19 = (__k->Right).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pbVar16 = (__k->Right).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            if (local_98 + 1 < (ulong)((long)pbVar16 - (long)pbVar19 >> 5)) {
              bVar37 = false;
              uVar32 = local_98 + 1;
              uVar35 = local_98;
              pkStack_c0 = __k_00;
              do {
                uVar24 = uVar32;
                if ((byte)(*pbVar19[uVar24]._M_dataplus._M_p | 2U) != 0x3e) break;
                if (local_34[0] == -NAN) {
                  bVar37 = true;
                }
                else {
                  uVar32 = (long)rhs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                 ._M_impl.super__Vector_impl_data._M_start - (long)puStack_118;
                  std::__cxx11::string::substr((ulong)auStack_68,(ulong)(pbVar19 + uVar24));
                  iVar12 = std::
                           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                   *)&checkForErrorAndReport.errorCount,(key_type *)auStack_68);
                  if (iVar12._M_node == (_Base_ptr)&nonTerminals) {
                    pfVar20 = (float *)std::
                                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                       ::operator[]((
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                                  *)&checkForErrorAndReport.errorCount,
                                                  (key_type *)auStack_68);
                    *pfVar20 = local_38;
                    local_38 = (float)((int)local_38 + 1);
                  }
                  pmVar21 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                          *)&checkForErrorAndReport.errorCount,
                                         (key_type *)auStack_68);
                  auStack_88._0_4_ = *pmVar21;
                  local_b8 = (pointer)CONCAT44(local_b8._4_4_,(int)(uVar32 >> 2));
                  this_02 = std::
                            map<unsigned_int,_SGParser::Generator::Production::ConflictAction,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SGParser::Generator::Production::ConflictAction>_>_>
                            ::operator[]((map<unsigned_int,_SGParser::Generator::Production::ConflictAction,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SGParser::Generator::Production::ConflictAction>_>_>
                                          *)&p.LeftChain.
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                         (key_type *)&local_b8);
                  p_Var25 = (this_02->Actions)._M_t._M_impl.super__Rb_tree_header._M_header.
                            _M_parent;
                  if (p_Var25 == (_Base_ptr)0x0) {
LAB_00131047:
                    cVar4 = *(__k->Right).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar24]._M_dataplus._M_p;
                    pmVar15 = std::
                              map<unsigned_int,_SGParser::Generator::Production::ConflictAction::Action,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SGParser::Generator::Production::ConflictAction::Action>_>_>
                              ::operator[](&this_02->Actions,(key_type *)auStack_88);
                    *pmVar15 = (uint)(cVar4 != '>');
                  }
                  else {
                    p_Var33 = &(this_02->Actions)._M_t._M_impl.super__Rb_tree_header;
                    p_Var28 = &p_Var33->_M_header;
                    do {
                      bVar36 = p_Var25[1]._M_color < (uint)auStack_88._0_4_;
                      if (!bVar36) {
                        p_Var28 = p_Var25;
                      }
                      p_Var25 = (&p_Var25->_M_left)[bVar36];
                    } while (p_Var25 != (_Base_ptr)0x0);
                    if (((_Rb_tree_header *)p_Var28 == p_Var33) ||
                       ((uint)auStack_88._0_4_ < p_Var28[1]._M_color)) goto LAB_00131047;
                    CreateSymbolMap::anon_class_16_2_e3ac8062::operator()
                              ((anon_class_16_2_e3ac8062 *)local_160,line,
                               "Multiple conflict actions on nonterminal %s before \'%s\'",
                               auStack_68,(pkStack_c0->_M_dataplus)._M_p);
                  }
                  if (auStack_68 !=
                      (undefined1  [8])
                      &leftSymbolId.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish) {
                    operator_delete((void *)auStack_68,
                                    (long)leftSymbolId.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_finish + 1);
                  }
                  pbVar19 = (__k->Right).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  pbVar16 = (__k->Right).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                }
                uVar32 = uVar24 + 1;
                uVar35 = uVar24;
              } while (uVar24 + 1 < (ulong)((long)pbVar16 - (long)pbVar19 >> 5));
              __k_00 = pkStack_c0;
              local_98 = uVar35;
              if (bVar37) {
                CreateSymbolMap::anon_class_16_2_e3ac8062::operator()
                          ((anon_class_16_2_e3ac8062 *)local_160,line,
                           "Conflict actions before nonterminal %s",(pkStack_c0->_M_dataplus)._M_p);
              }
            }
            if (local_34[0] == -NAN) {
              iVar12 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                       ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                               *)&checkForErrorAndReport.errorCount,__k_00);
              if (iVar12._M_node == (_Base_ptr)&nonTerminals) {
                pfVar20 = (float *)std::
                                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                                 *)&checkForErrorAndReport.errorCount,__k_00);
                *pfVar20 = local_38;
                local_38 = (float)((int)local_38 + 1);
              }
              pfVar20 = (float *)std::
                                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                               *)&checkForErrorAndReport.errorCount,__k_00);
              local_34[0] = *pfVar20;
            }
            else {
              local_34[0] = (float)((uint)local_34[0] | 0x80000000);
              p_Var25 = (this->UserLex).Precedence._M_t._M_impl.super__Rb_tree_header._M_header.
                        _M_parent;
              prec = 0;
              p_Var28 = &p_Var3->_M_header;
              if (p_Var25 != (_Base_ptr)0x0) {
                do {
                  if ((uint)*(float *)(p_Var25 + 1) >= (uint)local_34[0]) {
                    p_Var28 = p_Var25;
                  }
                  p_Var25 = (&p_Var25->_M_left)[(uint)*(float *)(p_Var25 + 1) < (uint)local_34[0]];
                } while (p_Var25 != (_Base_ptr)0x0);
                if (((_Rb_tree_header *)p_Var28 != p_Var3) &&
                   ((uint)*(float *)&((_Rb_tree_header *)p_Var28)->_M_node_count <=
                    (uint)local_34[0])) {
                  pmVar17 = std::
                            map<unsigned_int,_SGParser::Generator::Grammar::TerminalPrec,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SGParser::Generator::Grammar::TerminalPrec>_>_>
                            ::operator[](&(this->UserLex).Precedence,(key_type *)local_34);
                  prec = pmVar17->Value & 0x3fffffff;
                }
              }
            }
            if (cVar29 != '$') {
              iVar12 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                       ::find(local_90,__k_00);
              fVar5 = local_34[0];
              if (iVar12._M_node ==
                  (_Base_ptr)nonTerminals._M_t._M_impl.super__Rb_tree_header._M_node_count) {
                pfVar20 = (float *)std::
                                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                                 *)local_90,__k_00);
                *pfVar20 = fVar5;
              }
              if (rhs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start ==
                  rhs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                _M_realloc_insert<unsigned_int_const&>
                          ((vector<unsigned_int,std::allocator<unsigned_int>> *)&puStack_118,
                           (iterator)
                           rhs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start,(uint *)local_34);
              }
              else {
                *rhs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start = (uint)local_34[0];
                rhs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start =
                     rhs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start + 1;
              }
            }
            uVar32 = local_98 + 1;
            pbVar19 = (__k->Right).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pbVar16 = (__k->Right).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            if ((ulong)((long)pbVar16 - (long)pbVar19 >> 5) <= uVar32) goto LAB_00130de1;
            __k_00 = pbVar19 + uVar32;
            pcVar27 = pbVar19[uVar32]._M_dataplus._M_p;
            cVar29 = *pcVar27;
            local_98 = uVar32;
          } while (cVar29 != '*');
        }
        auStack_88 = (undefined1  [8])0x0;
        leftSymbolErrorTerminal.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        leftSymbolErrorTerminal.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        vStack_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (uint *)0x0;
        local_b8 = (pointer)0x0;
        vStack_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        uVar32 = local_98;
        if (local_98 < (ulong)((long)pbVar16 - (long)pbVar19 >> 5)) {
          do {
            pkVar31 = pbVar19 + uVar32;
            cVar29 = *pbVar19[uVar32]._M_dataplus._M_p;
            local_98 = uVar32;
            if (cVar29 == '*') {
              pkStack_c0 = (key_type *)
                           leftSymbolErrorTerminal.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start;
              auVar22 = auStack_88;
              if (auStack_88 !=
                  (undefined1  [8])
                  leftSymbolErrorTerminal.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start) {
                do {
                  local_c4 = *(key_type *)&(((key_type *)auVar22)->_M_dataplus)._M_p;
                  p_Var18 = (_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                             *)std::
                               map<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                               ::operator[]((map<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                                             *)&p.ConflictActions._M_t._M_impl.super__Rb_tree_header
                                                ._M_node_count,&local_c4);
                  puVar26 = vStack_b0.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  auStack_68 = (undefined1  [8])p_Var18;
                  if (local_b8 !=
                      (pointer)vStack_b0.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start) {
                    pvVar34 = local_b8;
                    do {
                      std::
                      _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                      ::
                      _M_insert_unique_<unsigned_int&,std::_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>::_Alloc_node>
                                (p_Var18,(_Base_ptr)(p_Var18 + 8),(uint *)pvVar34,
                                 (_Alloc_node *)auStack_68);
                      pvVar34 = (pointer)((long)&(pvVar34->
                                                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                                 )._M_impl.super__Vector_impl_data._M_start + 4);
                    } while (pvVar34 != (pointer)puVar26);
                  }
                  auVar22 = (undefined1  [8])((long)&(((key_type *)auVar22)->_M_dataplus)._M_p + 4);
                } while (auVar22 != (undefined1  [8])pkStack_c0);
                if ((undefined1  [8])
                    leftSymbolErrorTerminal.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start != auStack_88) {
                  leftSymbolErrorTerminal.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)auStack_88;
                }
              }
              if ((pointer)vStack_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start != local_b8) {
                vStack_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)local_b8;
              }
              std::__cxx11::string::substr((ulong)auStack_68,(ulong)pkVar31);
              std::__cxx11::string::operator=((string *)pkVar31,(string *)auStack_68);
              if (auStack_68 !=
                  (undefined1  [8])
                  &leftSymbolId.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish) {
                operator_delete((void *)auStack_68,
                                (long)leftSymbolId.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_finish + 1);
              }
LAB_00130cbc:
              iVar12 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                       ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                               *)&checkForErrorAndReport.errorCount,pkVar31);
              if (iVar12._M_node == (_Base_ptr)&nonTerminals) {
                pfVar20 = (float *)std::
                                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                                 *)&checkForErrorAndReport.errorCount,pkVar31);
                *pfVar20 = local_38;
                local_38 = (float)((int)local_38 + 1);
              }
              pfVar20 = (float *)std::
                                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                               *)&checkForErrorAndReport.errorCount,pkVar31);
              local_34[0] = *pfVar20;
              if (leftSymbolErrorTerminal.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start ==
                  leftSymbolErrorTerminal.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                _M_realloc_insert<unsigned_int_const&>
                          ((vector<unsigned_int,std::allocator<unsigned_int>> *)auStack_88,
                           (iterator)
                           leftSymbolErrorTerminal.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start,(uint *)local_34);
              }
              else {
                *leftSymbolErrorTerminal.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start = (uint)local_34[0];
                pvVar14 = &leftSymbolErrorTerminal;
                puVar26 = leftSymbolErrorTerminal.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start;
LAB_00130d78:
                (pvVar14->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start = puVar26 + 1;
              }
            }
            else {
              if (cVar29 != '+') goto LAB_00130cbc;
              std::__cxx11::string::substr((ulong)auStack_68,(ulong)pkVar31);
              std::__cxx11::string::operator=((string *)pkVar31,(string *)auStack_68);
              if (auStack_68 !=
                  (undefined1  [8])
                  &leftSymbolId.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish) {
                operator_delete((void *)auStack_68,
                                (long)leftSymbolId.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_finish + 1);
              }
              if (*(pkVar31->_M_dataplus)._M_p == '\'') {
                std::__cxx11::string::substr((ulong)auStack_68,(ulong)pkVar31);
                std::__cxx11::string::operator=((string *)pkVar31,(string *)auStack_68);
                if (auStack_68 !=
                    (undefined1  [8])
                    &leftSymbolId.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish) {
                  operator_delete((void *)auStack_68,
                                  (long)leftSymbolId.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_finish + 1);
                }
                iVar12 = std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         ::find(&this_00->_M_t,pkVar31);
                pcVar27 = "Undefined terminal alias referenced - \'%s\' inside of the %reduce()";
                if ((_Rb_tree_header *)iVar12._M_node == p_Var1) goto LAB_00130da6;
                puVar13 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                          ::operator[](this_00,pkVar31);
LAB_00130d53:
                local_34[0] = (float)(*puVar13 | 0x80000000);
                if (vStack_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start ==
                    vStack_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish) {
                  std::vector<unsigned_int,std::allocator<unsigned_int>>::
                  _M_realloc_insert<unsigned_int_const&>
                            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_b8,
                             (iterator)
                             vStack_b0.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start,(uint *)local_34);
                  goto LAB_00130d7f;
                }
                *vStack_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start = (uint)local_34[0];
                pvVar14 = &vStack_b0;
                puVar26 = vStack_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                goto LAB_00130d78;
              }
              iVar12 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                       ::find(&this_01->_M_t,pkVar31);
              pcVar27 = "Undefined terminal referenced - \'%s\' inside of the %reduce()";
              if ((_Rb_tree_header *)iVar12._M_node != p_Var2) {
                puVar13 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                          ::operator[](this_01,pkVar31);
                goto LAB_00130d53;
              }
LAB_00130da6:
              CreateSymbolMap::anon_class_16_2_e3ac8062::operator()
                        ((anon_class_16_2_e3ac8062 *)local_160,line,pcVar27,
                         (pkVar31->_M_dataplus)._M_p);
            }
LAB_00130d7f:
            uVar32 = local_98 + 1;
            pbVar19 = (__k->Right).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          } while (uVar32 < (ulong)((long)(__k->Right).
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar19
                                   >> 5));
          pkStack_c0 = (key_type *)
                       leftSymbolErrorTerminal.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start;
          auVar22 = auStack_88;
          if (auStack_88 !=
              (undefined1  [8])
              leftSymbolErrorTerminal.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start) {
            do {
              local_c4 = *(key_type *)&(((key_type *)auVar22)->_M_dataplus)._M_p;
              p_Var18 = (_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                         *)std::
                           map<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                           ::operator[]((map<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                                         *)&p.ConflictActions._M_t._M_impl.super__Rb_tree_header.
                                            _M_node_count,&local_c4);
              puVar26 = vStack_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              auStack_68 = (undefined1  [8])p_Var18;
              if (local_b8 !=
                  (pointer)vStack_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start) {
                pvVar34 = local_b8;
                do {
                  std::
                  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                  ::
                  _M_insert_unique_<unsigned_int&,std::_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>::_Alloc_node>
                            (p_Var18,(_Base_ptr)(p_Var18 + 8),(uint *)pvVar34,
                             (_Alloc_node *)auStack_68);
                  pvVar34 = (pointer)((long)&(pvVar34->
                                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                             )._M_impl.super__Vector_impl_data._M_start + 4);
                } while (pvVar34 != (pointer)puVar26);
              }
              auVar22 = (undefined1  [8])((long)&(((key_type *)auVar22)->_M_dataplus)._M_p + 4);
            } while (auVar22 != (undefined1  [8])pkStack_c0);
          }
        }
        if (local_b8 != (pointer)0x0) {
          operator_delete(local_b8,(long)vStack_b0.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)local_b8
                         );
        }
        if (auStack_88 != (undefined1  [8])0x0) {
          operator_delete((void *)auStack_88,
                          (long)leftSymbolErrorTerminal.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)auStack_88);
        }
        bVar37 = true;
      }
      auStack_68 = (undefined1  [8])0x0;
      leftSymbolId.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      leftSymbolId.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      leftSymbolErrorTerminal.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      auStack_88 = (undefined1  [8])0x0;
      leftSymbolErrorTerminal.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      pbVar19 = (__k->Left).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((__k->Left).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != pbVar19) {
        uVar32 = 0;
        do {
          pkVar31 = pbVar19 + uVar32;
          iVar12 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                           *)&checkForErrorAndReport.errorCount,pkVar31);
          if (iVar12._M_node == (_Base_ptr)&nonTerminals) {
            local_34[0] = local_38;
            pfVar20 = (float *)std::
                               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                             *)&checkForErrorAndReport.errorCount,pkVar31);
            fVar5 = local_34[0];
            *pfVar20 = local_38;
            pfVar20 = (float *)std::
                               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                             *)local_90,pkVar31);
            local_38 = (float)((int)local_38 + 1);
            *pfVar20 = fVar5;
          }
          else {
            pfVar20 = (float *)std::
                               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                             *)&checkForErrorAndReport.errorCount,pkVar31);
            local_34[0] = *pfVar20;
          }
          if (leftSymbolId.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start ==
              leftSymbolId.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)auStack_68,
                       (iterator)
                       leftSymbolId.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start,(uint *)local_34);
          }
          else {
            *leftSymbolId.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start = (uint)local_34[0];
            leftSymbolId.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start =
                 leftSymbolId.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start + 1;
          }
          uVar35 = uVar32 + 1;
          pbVar19 = (__k->Left).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((uVar35 < (ulong)((long)(__k->Left).
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar19 >>
                               5)) && (*pbVar19[uVar35]._M_dataplus._M_p == '%')) {
            iVar12 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                     ::find(local_90,pbVar19 + uVar35);
            if (iVar12._M_node ==
                (_Base_ptr)nonTerminals._M_t._M_impl.super__Rb_tree_header._M_node_count) {
              uVar23 = uVar8 + 1;
              uVar10 = uVar8 | 0x40000000;
            }
            else {
              pmVar21 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                      *)local_90,
                                     (__k->Left).
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + uVar35);
              uVar10 = *pmVar21;
              uVar23 = uVar8;
            }
            local_b8 = (pointer)CONCAT44(local_b8._4_4_,uVar10);
            if (leftSymbolErrorTerminal.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start ==
                leftSymbolErrorTerminal.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_88,
                         (iterator)
                         leftSymbolErrorTerminal.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start,(uint *)&local_b8);
            }
            else {
              *leftSymbolErrorTerminal.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start = uVar10;
              leftSymbolErrorTerminal.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start =
                   leftSymbolErrorTerminal.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start + 1;
            }
            uVar35 = uVar32 + 2;
            uVar8 = uVar23;
          }
          else {
            local_b8 = (pointer)((ulong)local_b8 & 0xffffffff00000000);
            if (leftSymbolErrorTerminal.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start ==
                leftSymbolErrorTerminal.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_88,
                         (iterator)
                         leftSymbolErrorTerminal.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start,(uint *)&local_b8);
            }
            else {
              *leftSymbolErrorTerminal.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start = 0;
              leftSymbolErrorTerminal.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start =
                   leftSymbolErrorTerminal.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start + 1;
            }
          }
          pbVar19 = (__k->Left).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar32 = uVar35;
        } while (uVar35 < (ulong)((long)(__k->Left).
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar19
                                 >> 5));
        if ((undefined1  [8])
            leftSymbolId.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != auStack_68) {
          uVar32 = 0;
          do {
            puVar26 = rhs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            puVar13 = puStack_118;
            fVar5 = *(float *)((long)auStack_68 + uVar32 * 4);
            local_34[0] = fVar5;
            pmVar11 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                      ::operator[](&data->ProductionLines,&__k->Name);
            uVar35 = (long)puVar26 - (long)puVar13;
            pright = (uint *)0x0;
            if (uVar35 != 0) {
              pright = puVar13;
            }
            Production::SetProduction
                      ((Production *)local_2a0,&__k->Name,(uint)fVar5,pright,(uint)(uVar35 >> 2),
                       *pmVar11,prec);
            p.Line._4_4_ = *(pointer)((long)auStack_88 + uVar32 * 4);
            if (p.LeftChain.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start !=
                (pointer)p.ReduceOverrides._M_t._M_impl.super__Rb_tree_header._M_node_count) {
              p.LeftChain.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)p.ReduceOverrides._M_t._M_impl.super__Rb_tree_header._M_node_count;
            }
            if ((undefined1  [8])
                leftSymbolId.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_start != auStack_68) {
              lVar30 = 0;
              uVar35 = 0;
              auVar22 = auStack_68;
              puVar26 = leftSymbolId.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              do {
                if (uVar32 != uVar35) {
                  if (p.LeftChain.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start ==
                      p.LeftChain.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish) {
                    std::vector<unsigned_int,std::allocator<unsigned_int>>::
                    _M_realloc_insert<unsigned_int_const&>
                              ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                               &p.ReduceOverrides._M_t._M_impl.super__Rb_tree_header._M_node_count,
                               (iterator)
                               p.LeftChain.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                               (uint *)((long)auVar22 + lVar30));
                    auVar22 = auStack_68;
                    puVar26 = leftSymbolId.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start;
                  }
                  else {
                    *p.LeftChain.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start = *(uint *)((long)auVar22 + lVar30);
                    p.LeftChain.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start =
                         p.LeftChain.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_start + 1;
                  }
                }
                uVar35 = uVar35 + 1;
                lVar30 = lVar30 + 4;
              } while (uVar35 < (ulong)((long)puVar26 - (long)auVar22 >> 2));
            }
            std::
            _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
            ::clear((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                     *)&p.NotReported);
            if (bVar37) {
              std::
              _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
              ::operator=((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                           *)&p.NotReported,
                          (_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                           *)&p.ConflictActions._M_t._M_impl.super__Rb_tree_header._M_node_count);
            }
            if (__k->NotReported == true) {
              p.Line._0_1_ = 1;
            }
            std::
            vector<SGParser::Generator::Production,_std::allocator<SGParser::Generator::Production>_>
            ::push_back(productions,(value_type *)local_2a0);
            uVar32 = uVar32 + 1;
          } while (uVar32 < (ulong)((long)leftSymbolId.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_start -
                                    (long)auStack_68 >> 2));
        }
      }
      if (auStack_88 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_88,
                        (long)leftSymbolErrorTerminal.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)auStack_88);
      }
      if (auStack_68 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_68,
                        (long)leftSymbolId.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)auStack_68);
      }
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                   *)&p.ConflictActions._M_t._M_impl.super__Rb_tree_header._M_node_count);
      if (puStack_118 != (uint *)0x0) {
        operator_delete(puStack_118,
                        (long)rhs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)puStack_118);
      }
      Production::~Production((Production *)local_2a0);
      __k = __k + 1;
    } while (__k != pPVar6);
  }
  pkVar31 = (data->OrderedStartSymbols).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pkVar7 = (data->OrderedStartSymbols).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pkVar31 != pkVar7) {
    do {
      iVar12 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                       *)&checkForErrorAndReport.errorCount,pkVar31);
      if (iVar12._M_node == (_Base_ptr)&nonTerminals) {
        pmVar11 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                  ::operator[](&data->ProductionStartSymbols,pkVar31);
        CreateSymbolMap::anon_class_16_2_e3ac8062::operator()
                  ((anon_class_16_2_e3ac8062 *)local_160,*pmVar11,
                   "Undefined production starting symbol %s",(pkVar31->_M_dataplus)._M_p);
      }
      else {
        __position._M_current =
             (startSymbols->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
             .super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (startSymbols->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)startSymbols,__position,
                     &iVar12._M_node[2]._M_color);
        }
        else {
          *__position._M_current = iVar12._M_node[2]._M_color;
          (startSymbols->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
      }
      pkVar31 = pkVar31 + 1;
    } while (pkVar31 != pkVar7);
  }
  bVar37 = reduceData._M_t._M_impl.super__Rb_tree_header._M_node_count == 0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               *)&checkForErrorAndReport.errorCount);
  return bVar37;
}

Assistant:

bool StdGrammarParseData::CreateSymbolMap(StdGrammarParseHandler& data,
                                          std::map<String, unsigned>& symbols,
                                          std::vector<Production>& productions,
                                          std::vector<unsigned>& startSymbols) {
    size_t errorCount = 0u;

    // Check for an error and report if needed
    const auto checkForErrorAndReport = [&](size_t line, const char* text...) {
        if (Messages.GetMessageFlags() & ParseMessageBuffer::MessageError) {
            va_list argList;
            va_start(argList, text);
            const auto msgText = StringWithVAFormat(text, argList);
            va_end(argList);

            const ParseMessage msg{ParseMessage::ErrorMessage, "", msgText, 0u, line};
            Messages.AddMessage(msg);
        }
        ++errorCount;
    };

    std::map<String, unsigned> nonTerminals;

    // NonTerminal id counter
    auto idCounter         = 0u;
    // Terminal id counter - extra terminals will be added to handle %error(Name)
    auto terminalIdCounter = unsigned(UserLex.TokenLexemes.size()) + TokenCode::TokenFirstID;

    for (auto& prod: data.Productions) {
        Production                             p;
        std::vector<unsigned>                  rhs;
        std::map<unsigned, std::set<unsigned>> reduceData;
        unsigned symbolId;
        unsigned precValue   = 0u;
        bool     reduceValue = false;
        size_t   iright;
        auto&    left        = prod.Left;
        auto&    right       = prod.Right;
        size_t   line        = data.ProductionLines[prod.Name];

        // Form right hand side list
        for (iright = 0u; iright < right.size(); ++iright) {
            bool  prec   = false;
            auto& symbol = right[iright];

            // Check to see if it is the beginning of the reduce overrides
            if (symbol[0u] == '*') {
                reduceValue = true;
                break;
            }

            // Check for precedence
            if (symbol[0u] == '$') {
                // Eat precedence marker '$'
                symbol = symbol.substr(1u);
                prec   = true;
            }

            // Search to see if it is a terminal
            symbolId = NFA::InvalidLexeme;
            // Terminal alias references will have special ' marker up front
            if (symbol[0u] == '\'') {
                // Eat alias marker quote
                symbol = symbol.substr(1u);

                if (UserLex.LexemeAliasToToken.find(symbol) != UserLex.LexemeAliasToToken.end())
                    symbolId = UserLex.LexemeAliasToToken[symbol];
                else
                    // ERROR: Undefined alias referenced
                    checkForErrorAndReport(line, "Undefined alias referenced - '%s'",
                                           symbol.data());
            } else {
                // If symbol has a % in front of it, it must be one of %error( ) directives
                if (symbol[0u] == '%' && symbol[6u] == '(') {
                    // Must be %error(Name)
                    // Make an error terminal, and reference it
                    // Assign it an Id, so it will be stored as a terminal in Symbols
                    if (symbols.find(symbol) == symbols.end())
                        symbolId = terminalIdCounter++ | ProductionMask::ErrorTerminal;
                    else
                        symbolId = symbols[symbol];
                } else {
                    // Standard terminal processing
                    // See if this is a terminal name declared in expressions
                    if (UserLex.LexemeNameToToken.find(symbol) != UserLex.LexemeNameToToken.end())
                        symbolId = UserLex.LexemeNameToToken[symbol];
                    // Special terminal - error, code TokenCode::TCode::TokenError
                    else if (symbol == "%error")
                        symbolId = TokenCode::TokenError;
                    else if (symbol == "%error_backtrack")
                        symbolId = TokenCode::TokenError | ProductionMask::BacktrackError;
                    else {} // Otherwise it is an error
                }
            }

            // Read in any conflict actions
            bool conflictActionsError = false;

            while (iright + 1u < right.size() &&
                   (right[iright + 1u][0u] == '>' || right[iright + 1u][0u] == '<')) {
                ++iright;
                // Terminal must follow %shifton, %reduceon
                if (symbolId != NFA::InvalidLexeme) {
                    // Get nonterminal id
                    unsigned   id;
                    const auto index = rhs.size();
                    const auto s     = right[iright].substr(1u);

                    // Get Nonterminal Id
                    // If this nonterminal wasn't seen yet, assign it an id
                    if (nonTerminals.find(s) == nonTerminals.end())
                        nonTerminals[s] = idCounter++;
                    id = nonTerminals[s];

                    // Make sure there isn't an action on this nonterminal already
                    Production::ConflictAction & action = p.ConflictActions[unsigned(index)];
                    if (action.Actions.find(id) != action.Actions.end())
                        // Error: Multiple conflict
                        checkForErrorAndReport(line,
                                               "Multiple conflict actions on nonterminal %s before '%s'",
                                               s.data(), symbol.data());
                    else
                        // Store action
                        action.Actions[id] = right[iright][0u] == '>'
                                                 ? Production::ConflictAction::Action::Shift
                                                 : Production::ConflictAction::Action::Reduce;
                } else
                    // Conflict actions can only appear before a terminal
                    conflictActionsError = true;
            }

            // Conflict actions defined for nonterminal
            if (conflictActionsError)
                // Error: Multiple conflict actions
                checkForErrorAndReport(line, "Conflict actions before nonterminal %s",
                                       symbol.data());

            // Terminal - mark it with Terminal flag
            if (symbolId != NFA::InvalidLexeme) {
                symbolId |= ProductionMask::Terminal;

                // Get the precedence value
                if (UserLex.Precedence.find(symbolId) != UserLex.Precedence.end())
                    precValue = UserLex.Precedence[symbolId].Value &
                                Grammar::TerminalPrec::PrecMask;
                else
                    precValue = 0u;
            } else {
                // It's a nonterminal
                // If it's not defined yet, assign an Id to this nonterminal
                if (nonTerminals.find(symbol) == nonTerminals.end())
                    nonTerminals[symbol] = idCounter++;
                // And return Id to store
                symbolId = nonTerminals[symbol];
            }

            if (!prec) {
                // Make sure to add it to grammarSymbols
                if (symbols.find(symbol) == symbols.end())
                    symbols[symbol] = symbolId;

                // And store Id into production
                rhs.push_back(symbolId);
            }
        }

        // Build reduce overrides map
        if (reduceValue) {
            std::vector<unsigned> nonTerminalIds;
            std::vector<unsigned> terminalIds;

            for (auto ireduce = iright; ireduce < right.size(); ++ireduce) {
                auto& symbol = right[ireduce];

                // It is a terminal
                if (symbol[0u] == '+') {
                    symbol = symbol.substr(1u);
                    // Terminal alias references will have special ' marker up front
                    if (symbol[0u] == '\'') {
                        // Eat alias marker quote
                        symbol = symbol.substr(1u);

                        if (UserLex.LexemeAliasToToken.find(symbol) !=
                            UserLex.LexemeAliasToToken.end()) {
                            symbolId = UserLex.LexemeAliasToToken[symbol] |
                                       ProductionMask::Terminal;
                            terminalIds.push_back(symbolId);
                        } else
                            // ERROR: Undefined terminal alias referenced
                            checkForErrorAndReport(line,
                                                   "Undefined terminal alias referenced - '%s' inside of the %reduce()",
                                                   symbol.data());
                    } else if (UserLex.LexemeNameToToken.find(symbol) !=
                               UserLex.LexemeNameToToken.end()) {
                        symbolId = UserLex.LexemeNameToToken[symbol] | ProductionMask::Terminal;
                        terminalIds.push_back(symbolId);
                    } else
                        // ERROR: Undefined terminal referenced
                        checkForErrorAndReport(line,
                                               "Undefined terminal referenced - '%s' inside of the %reduce()",
                                               symbol.data());
                    continue;
                }

                // It is the first Nonterminal in the set
                if (symbol[0u] == '*') {
                    // store the last reduce data
                    for (const auto nonterm: nonTerminalIds)
                        reduceData[nonterm].insert(terminalIds.begin(), terminalIds.end());

                    // Reset the arrays
                    nonTerminalIds.clear();
                    terminalIds.clear();

                    // Eat the '*' marker
                    symbol = symbol.substr(1u);
                }

                // If it's not defined yet, assign an Id to this nonterminal
                if (nonTerminals.find(symbol) == nonTerminals.end())
                    nonTerminals[symbol] = idCounter++;
                // And return Id to store
                symbolId = nonTerminals[symbol];

                nonTerminalIds.push_back(symbolId);
            }

            // Store the last reduce data
            for (const auto nonterm: nonTerminalIds)
                reduceData[nonterm].insert(terminalIds.begin(), terminalIds.end());
        }

        // Build an array of LHS nonterminal symbol ids
        std::vector<unsigned> leftSymbolId;
        std::vector<unsigned> leftSymbolErrorTerminal;

        for (size_t ileft = 0u; ileft < left.size(); ++ileft) {
            // Store & get id for Left nonterminal
            const auto& symbol = left[ileft];

            if (nonTerminals.find(symbol) != nonTerminals.end())
                symbolId = nonTerminals[symbol];
            else {
                // Assign nonterminal Id
                symbolId = idCounter++;
                nonTerminals[symbol] = symbolId;
                // And record nonterminal symbol
                symbols[symbol]      = symbolId;
            }
            leftSymbolId.push_back(symbolId);

            // If we have associated %error
            if (ileft + 1u < left.size() && left[ileft + 1u][0u] == '%') {
                // Store error terminal's symbol id (might need to assign a new one)
                leftSymbolErrorTerminal.push_back(
                    symbols.find(left[ileft + 1u]) == symbols.end()
                        ? terminalIdCounter++ | ProductionMask::ErrorTerminal
                        : symbols[left[ileft + 1u]]);
                ++ileft;
            } else
                leftSymbolErrorTerminal.push_back(0);
        }

        // Store a production for all left hand side nonterminals
        for (size_t ileft = 0u; ileft < leftSymbolId.size(); ++ileft) {
            // Get the symbol id
            symbolId = leftSymbolId[ileft];

            // Finally store production value
            unsigned* const rght = rhs.size() ? &rhs[0] : nullptr;
            p.SetProduction(prod.Name, symbolId, rght, unsigned(rhs.size()),
                            data.ProductionLines[prod.Name], precValue);
            p.ErrorTerminal = leftSymbolErrorTerminal[ileft];

            // Build the left hand chain
            p.LeftChain.clear();
            for (size_t ichain = 0u; ichain < leftSymbolId.size(); ++ichain)
                // Make sure not to add the same nonterminal
                if (ichain != ileft)
                    p.LeftChain.push_back(leftSymbolId[ichain]);

            // Add the reduce overrides data
            p.ReduceOverrides.clear();
            if (reduceValue)
                p.ReduceOverrides = reduceData;

            // If its an action production don't report it
            if (prod.NotReported)
                p.NotReported = true;

            productions.push_back(p);
        }
    }

    // Process starting symbols
    for (const auto& symbol: data.OrderedStartSymbols)
        if (const auto inonTerminals = nonTerminals.find(symbol);
            inonTerminals == nonTerminals.end())
            // Error: Undefined production start symbol
            checkForErrorAndReport(data.ProductionStartSymbols[symbol],
                                   "Undefined production starting symbol %s", symbol.data());
        else
            // Store starting production's nonterminal Id
            startSymbols.push_back(inonTerminals->second);

    return errorCount == 0u;
}